

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O2

void dtl_sv_to_string_internal(dtl_sv_t *self,adt_str_t *str,_Bool *ok)

{
  _Bool _Var1;
  uint uVar2;
  void *pvVar3;
  char *pcVar4;
  float fVar5;
  double dVar6;
  char numBuf [128];
  char acStack_98 [136];
  
  if (self == (dtl_sv_t *)0x0) {
switchD_00104e89_caseD_0:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    adt_str_append_cstr(str,"(undefined)");
    return;
  }
  switch(self->u32Flags >> 4 & 0xf) {
  case 0:
    goto switchD_00104e89_caseD_0;
  case 1:
  case 7:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    uVar2 = dtl_sv_to_i32(self,(_Bool *)0x0);
    pcVar4 = "%d";
    goto LAB_00104f16;
  case 2:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    uVar2 = dtl_sv_to_u32(self,(_Bool *)0x0);
    pcVar4 = "%u";
LAB_00104f16:
    sprintf(acStack_98,pcVar4,(ulong)uVar2);
    goto LAB_00104f9f;
  case 3:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    pvVar3 = (void *)dtl_sv_to_i64(self,(_Bool *)0x0);
    pcVar4 = "%lld";
    break;
  case 4:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    pvVar3 = (void *)dtl_sv_to_u64(self,(_Bool *)0x0);
    pcVar4 = "%llu";
    break;
  case 5:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    fVar5 = dtl_sv_to_flt(self,(_Bool *)0x0);
    dVar6 = (double)fVar5;
    goto LAB_00104f60;
  case 6:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    dVar6 = dtl_sv_to_dbl(self,(_Bool *)0x0);
LAB_00104f60:
    sprintf(acStack_98,"%f",dVar6);
    dtl_sv_ztrim(acStack_98);
    goto LAB_00104f9f;
  case 8:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    _Var1 = dtl_sv_to_bool(self,(_Bool *)0x0);
    if (_Var1) {
      pcVar4 = "true";
    }
    else {
      pcVar4 = "false";
    }
    adt_str_set_cstr(str,pcVar4);
    return;
  case 9:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    adt_str_set(str,(self->pAny->val).i64);
    return;
  case 10:
    if (ok != (_Bool *)0x0) {
      *ok = true;
    }
    pvVar3 = dtl_sv_to_ptr(self);
    pcVar4 = "%p";
    break;
  default:
    goto switchD_00104e89_default;
  }
  sprintf(acStack_98,pcVar4,pvVar3);
LAB_00104f9f:
  adt_str_set_cstr(str,acStack_98);
switchD_00104e89_default:
  return;
}

Assistant:

static void dtl_sv_to_string_internal(const dtl_sv_t* self, adt_str_t* str, bool* ok)
{
   char numBuf[MAX_NUM_BUF];
   bool isNum = false;
   switch(dtl_sv_type(self))
   {
   case DTL_SV_NONE:
      if (ok != NULL) *ok = true;
      adt_str_append_cstr(str,"(undefined)");
      break;
   case DTL_SV_I32:
   case DTL_SV_CHAR:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%d", (int) dtl_sv_to_i32(self, NULL));
      isNum = true;
      break;
   case DTL_SV_U32:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%u", (unsigned int) dtl_sv_to_u32(self, NULL));
      isNum = true;
      break;
   case DTL_SV_I64:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%lld", (long long int) dtl_sv_to_i64(self, NULL));
      isNum = true;
      break;
   case DTL_SV_U64:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%llu", (long long unsigned int) dtl_sv_to_u64(self, NULL));
      isNum = true;
      break;
   case DTL_SV_FLT:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%f", (double) dtl_sv_to_flt(self, NULL));
      isNum = true;
      dtl_sv_ztrim(numBuf);
      break;
   case DTL_SV_DBL:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%f", dtl_sv_to_dbl(self, NULL));
      isNum = true;
      dtl_sv_ztrim(numBuf);
      break;
   case DTL_SV_BOOL:
      if (ok != NULL) *ok = true;
      if(dtl_sv_to_bool(self, NULL))
      {
         adt_str_set_cstr(str, "true");
      }
      else
      {
         adt_str_set_cstr(str, "false");
      }
      break;
   case DTL_SV_STR:
      if (ok != NULL) *ok = true;
      adt_str_set(str, self->pAny->val.str);
      break;
   case DTL_SV_PTR:
      if (ok != NULL) *ok = true;
      sprintf(numBuf,"%p", dtl_sv_to_ptr(self));
      isNum = true;
      break;
   case DTL_SV_DV:
      //No conversion available
      break;
   case DTL_SV_BYTES:
      //No conversion available
      break;
   case DTL_SV_BYTEARRAY:
      //No conversion available
      break;
   }
   if(isNum)
   {
      adt_str_set_cstr(str, numBuf);
   }
}